

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileTests.cpp
# Opt level: O2

void __thiscall
solitaire::piles::StockPileWithCardsTest_tryPullOutLastCard_Test::TestBody
          (StockPileWithCardsTest_tryPullOutLastCard_Test *this)

{
  pointer pCVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 extraout_DL;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  char *pcVar2;
  AssertHelper local_68;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  _Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_38;
  Card lastCard;
  
  pCVar1 = (this->super_StockPileWithCardsTest).pileCards.
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lastCard = pCVar1[-1];
  (this->super_StockPileWithCardsTest).pileCards.
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_finish = pCVar1 + -1;
  (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
      super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_StockPile).super_Archiver._vptr_Archiver[4])();
  (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
      super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_StockPile).super_Archiver._vptr_Archiver[4])();
  (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
      super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_StockPile).super_Archiver._vptr_Archiver[4])();
  gtest_ar_1._0_4_ =
       (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
           super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_StockPile).super_Archiver._vptr_Archiver[5])();
  gtest_ar_1._4_4_ = extraout_var;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = extraout_DL;
  testing::internal::CmpHelperEQ<std::optional<solitaire::cards::Card>,solitaire::cards::Card>
            ((internal *)&gtest_ar,"pile->tryPullOutCard()","lastCard",
             (optional<solitaire::cards::Card> *)&gtest_ar_1,&lastCard);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (gtest_ar_1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
              *)&local_38,(testing *)&(this->super_StockPileWithCardsTest).pileCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
              *)&gtest_ar,(internal *)&local_38,matcher);
  (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
      super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_StockPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&gtest_ar_1,&gtest_ar.success_,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            ((_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             &gtest_ar);
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&local_38);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)
        CONCAT71(gtest_ar_1.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._1_7_,
                 gtest_ar_1.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_1_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._1_7_,
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  gtest_ar_1._0_4_ =
       (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
           super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_StockPile).super_Archiver._vptr_Archiver[7])();
  gtest_ar_1._4_4_ = extraout_var_00;
  local_68.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,int>
            ((internal *)&gtest_ar,"pile->getSelectedCardIndex()","1",
             (optional<unsigned_int> *)&gtest_ar_1,(int *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (gtest_ar_1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(StockPileWithCardsTest, tryPullOutLastCard) {
    const Card lastCard = pileCards.back();
    pileCards.pop_back();

    pile->trySelectNextCard();
    pile->trySelectNextCard();
    pile->trySelectNextCard();

    EXPECT_EQ(pile->tryPullOutCard(), lastCard);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getSelectedCardIndex(), 1);
}